

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderGrid.cpp
# Opt level: O3

void __thiscall OrderGrid::incDec(OrderGrid *this,int amount)

{
  short sVar1;
  short sVar2;
  undefined1 auVar3 [13];
  uint5 uVar4;
  undefined1 auVar5 [13];
  int iVar6;
  int iVar7;
  uchar uVar8;
  undefined1 auVar9 [16];
  OrderRow row;
  OrderRow local_14;
  
  local_14 = PatternModel::currentOrderRow(this->mModel);
  if (this->mChangeAll == true) {
    auVar3[0xc] = local_14._M_elems[3];
    auVar3._0_12_ = ZEXT712(0);
    uVar4 = CONCAT32(auVar3._10_3_,(ushort)local_14._M_elems[2]);
    auVar5._5_8_ = 0;
    auVar5._0_5_ = uVar4;
    auVar9._0_4_ = ((uint)local_14._M_elems & 0xff) + amount;
    auVar9._4_4_ = (int)CONCAT72(SUB137(auVar5 << 0x40,6),(ushort)local_14._M_elems[1]) + amount;
    auVar9._8_4_ = (int)uVar4 + amount;
    auVar9._12_4_ = (uint)(uint3)(auVar3._10_3_ >> 0x10) + amount;
    auVar9 = packssdw(auVar9,auVar9);
    sVar1 = auVar9._0_2_;
    sVar2 = auVar9._2_2_;
    local_14._M_elems[1] = (0 < sVar2) * (sVar2 < 0x100) * auVar9[2] - (0xff < sVar2);
    local_14._M_elems[0] = (0 < sVar1) * (sVar1 < 0x100) * auVar9[0] - (0xff < sVar1);
    sVar1 = auVar9._4_2_;
    local_14._M_elems[2] = (0 < sVar1) * (sVar1 < 0x100) * auVar9[4] - (0xff < sVar1);
    sVar1 = auVar9._6_2_;
    local_14._M_elems[3] = (0 < sVar1) * (sVar1 < 0x100) * auVar9[6] - (0xff < sVar1);
  }
  else {
    iVar6 = PatternModel::cursorTrack(this->mModel);
    iVar7 = (uint)local_14._M_elems[iVar6] + amount;
    if (0xfe < iVar7) {
      iVar7 = 0xff;
    }
    uVar8 = '\0';
    if (0 < iVar7) {
      uVar8 = (uchar)iVar7;
    }
    local_14._M_elems[iVar6] = uVar8;
  }
  PatternModel::setOrderRow(this->mModel,local_14);
  return;
}

Assistant:

void OrderGrid::incDec(int amount) {
    auto row = mModel.currentOrderRow();

    auto addId = [amount](uint8_t &id) {
        id = (uint8_t)std::clamp((int)id + amount, 0, 0xFF);
    };
    
    if (mChangeAll) {
        std::for_each(row.begin(), row.end(), addId);
    } else {
        addId(row[mModel.cursorTrack()]);
    }

    mModel.setOrderRow(row);
}